

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

int lgx_type_is_fit(lgx_type_t *src,lgx_type_t *dst)

{
  lgx_type_map_s *src_00;
  lgx_type_map_s *dst_00;
  int iVar1;
  uint uVar2;
  
  do {
    switch(src->type) {
    case T_UNKNOWN:
      return 1;
    default:
      uVar2 = lgx_type_cmp(src,dst);
      return uVar2 ^ 1;
    case T_ARRAY:
      if (dst->type != T_ARRAY) {
        return 0;
      }
      src = &((src->u).arr)->value;
      dst = &((dst->u).arr)->value;
      break;
    case T_MAP:
      if (dst->type != T_MAP) {
        return 0;
      }
      src_00 = (src->u).map;
      dst_00 = (dst->u).map;
      iVar1 = lgx_type_is_fit(&src_00->key,&dst_00->key);
      if (iVar1 == 0) {
        return 0;
      }
      src = &src_00->value;
      dst = &dst_00->value;
      break;
    case T_STRUCT:
    case T_INTERFACE:
    case T_FUNCTION:
      return 0;
    }
  } while( true );
}

Assistant:

int lgx_type_is_fit(lgx_type_t* src, lgx_type_t* dst) {
    switch (src->type) {
        case T_UNKNOWN:
            return 1;
        case T_ARRAY:
            if (dst->type != T_ARRAY) {
                return 0;
            }
            return lgx_type_is_fit(&src->u.arr->value, &dst->u.arr->value);
        case T_MAP:
            if (dst->type != T_MAP) {
                return 0;
            }
            if (!lgx_type_is_fit(&src->u.map->key, &dst->u.map->key)) {
                return 0;
            }
            return lgx_type_is_fit(&src->u.map->value, &dst->u.map->value);
        case T_STRUCT:
        case T_INTERFACE:
        case T_FUNCTION:
            // TODO
            return 0;
        default:
            return !lgx_type_cmp(src, dst);
    }
}